

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_dump.hpp
# Opt level: O0

void ELFIO::dump::segment_data(ostream *out,Elf_Half no,segment *seg)

{
  ulong uVar1;
  _Setfill<char> _Var2;
  int iVar3;
  _Setw _Var4;
  ostream *poVar5;
  void *pvVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  unsigned_long *puVar7;
  unsigned_long local_40;
  ulong local_38;
  Elf_Xword i;
  char *pdata;
  segment *psStack_20;
  fmtflags original_flags;
  segment *seg_local;
  ostream *poStack_10;
  Elf_Half no_local;
  ostream *out_local;
  
  psStack_20 = seg;
  seg_local._6_2_ = no;
  poStack_10 = out;
  pdata._4_4_ = std::ios_base::flags((ios_base *)(out + *(long *)(*(long *)out + -0x18)));
  poVar5 = std::operator<<(poStack_10,"Segment # ");
  pvVar6 = (void *)std::ostream::operator<<(poVar5,seg_local._6_2_);
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  iVar3 = (*psStack_20->_vptr_segment[0x12])();
  i = CONCAT44(extraout_var,iVar3);
  if (i != 0) {
    local_38 = 0;
    while( true ) {
      uVar1 = local_38;
      iVar3 = (*psStack_20->_vptr_segment[0xd])();
      local_40 = CONCAT44(extraout_var_00,iVar3);
      puVar7 = std::min<unsigned_long>(&local_40,&MAX_DATA_ENTRIES);
      if (*puVar7 <= uVar1) break;
      if ((local_38 & 0xf) == 0) {
        poVar5 = std::operator<<(poStack_10,"[");
        poVar5 = std::operator<<(poVar5,"0x");
        _Var4 = std::setw(8);
        poVar5 = std::operator<<(poVar5,_Var4);
        _Var2 = std::setfill<char>('0');
        poVar5 = std::operator<<(poVar5,_Var2._M_c);
        pvVar6 = (void *)std::ostream::operator<<(poVar5,std::hex);
        pvVar6 = (void *)std::ostream::operator<<(pvVar6,std::right);
        poVar5 = (ostream *)std::ostream::operator<<(pvVar6,local_38);
        std::operator<<(poVar5,"]");
      }
      poVar5 = std::operator<<(poStack_10," ");
      poVar5 = std::operator<<(poVar5,"0x");
      _Var4 = std::setw(2);
      poVar5 = std::operator<<(poVar5,_Var4);
      _Var2 = std::setfill<char>('0');
      poVar5 = std::operator<<(poVar5,_Var2._M_c);
      pvVar6 = (void *)std::ostream::operator<<(poVar5,std::hex);
      pvVar6 = (void *)std::ostream::operator<<(pvVar6,std::right);
      std::ostream::operator<<(pvVar6,(uint)*(byte *)(i + local_38));
      if ((local_38 & 0xf) == 0xf) {
        std::ostream::operator<<(poStack_10,std::endl<char,std::char_traits<char>>);
      }
      local_38 = local_38 + 1;
    }
    if ((local_38 & 0xf) != 0) {
      std::ostream::operator<<(poStack_10,std::endl<char,std::char_traits<char>>);
    }
    std::ios_base::flags
              ((ios_base *)(poStack_10 + *(long *)(*(long *)poStack_10 + -0x18)),pdata._4_4_);
  }
  return;
}

Assistant:

static void
    segment_data( std::ostream& out, Elf_Half no, const segment* seg )
    {
        std::ios_base::fmtflags original_flags = out.flags();

        out << "Segment # " << no << std::endl;
        const char* pdata = seg->get_data();
        if ( pdata ) {
            ELFIO::Elf_Xword i;
            for ( i = 0; i < std::min( seg->get_file_size(), MAX_DATA_ENTRIES );
                  ++i ) {
                if ( i % 16 == 0 ) {
                    out << "[" << DUMP_HEX0x_FORMAT( 8 ) << i << "]";
                }

                out << " " << DUMP_HEX0x_FORMAT( 2 )
                    << ( pdata[i] & 0x000000FF );

                if ( i % 16 == 15 ) {
                    out << std::endl;
                }
            }
            if ( i % 16 != 0 ) {
                out << std::endl;
            }

            out.flags( original_flags );
        }

        return;
    }